

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

string * __thiscall
gflags::(anonymous_namespace)::FlagValue::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  uint uVar2;
  string *extraout_RAX;
  size_t sVar3;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  undefined8 uVar4;
  undefined1 in_DL;
  char *pcVar5;
  char intbuf [64];
  char acStack_58 [72];
  
  switch(in_DL) {
  case 0:
    bVar1 = *this;
    pcVar5 = "false";
    if ((ulong)bVar1 != 0) {
      pcVar5 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + ((ulong)bVar1 ^ 5));
    return extraout_RAX;
  case 1:
    uVar2 = *this;
    pcVar5 = "%d";
    break;
  case 2:
    uVar2 = *this;
    pcVar5 = "%u";
    break;
  case 3:
    uVar4 = *this;
    pcVar5 = "%ld";
    goto LAB_0013f420;
  case 4:
    uVar4 = *this;
    pcVar5 = "%lu";
LAB_0013f420:
    snprintf(acStack_58,0x40,pcVar5,uVar4);
    goto LAB_0013f46e;
  case 5:
    snprintf(acStack_58,0x40,"%.17g",*this);
    goto LAB_0013f46e;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*this,*(long *)((long)this + 8) + *this);
    return extraout_RAX_01;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x189,"string gflags::(anonymous namespace)::FlagValue::ToString() const");
  }
  snprintf(acStack_58,0x40,pcVar5,(ulong)uVar2);
LAB_0013f46e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(acStack_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_58,acStack_58 + sVar3);
  return extraout_RAX_00;
}

Assistant:

string FlagValue::ToString() const {
  char intbuf[64];    // enough to hold even the biggest number
  switch (type_) {
    case FV_BOOL:
      return VALUE_AS(bool) ? "true" : "false";
    case FV_INT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRId32, VALUE_AS(int32));
      return intbuf;
    case FV_UINT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu32, VALUE_AS(uint32));
      return intbuf;
    case FV_INT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRId64, VALUE_AS(int64));
      return intbuf;
    case FV_UINT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu64, VALUE_AS(uint64));
      return intbuf;
    case FV_DOUBLE:
      snprintf(intbuf, sizeof(intbuf), "%.17g", VALUE_AS(double));
      return intbuf;
    case FV_STRING:
      return VALUE_AS(string);
    default:
      assert(false);
      return "";  // unknown type
  }
}